

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O0

void * aligned_malloc(size_t required_bytes,size_t alignment)

{
  int iVar1;
  void *pvVar2;
  long in_RSI;
  long in_RDI;
  int offset;
  void **p2;
  void *p1;
  undefined8 local_8;
  
  iVar1 = (int)in_RSI + 7;
  pvVar2 = malloc(in_RDI + iVar1);
  if (pvVar2 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)((long)pvVar2 + (long)iVar1 & (in_RSI - 1U ^ 0xffffffffffffffff));
    *(void **)((long)local_8 - 8) = pvVar2;
  }
  return local_8;
}

Assistant:

inline void *aligned_malloc(size_t required_bytes, size_t alignment) {
    void *p1;  // original block
    void **p2; // aligned block
    int offset = alignment - 1 + sizeof(void *);
    if ((p1 = (void *)malloc(required_bytes + offset)) == NULL) {
       return NULL;
    }
    p2 = (void **)(((size_t)(p1) + offset) & ~(alignment - 1));
    p2[-1] = p1;
    return p2;
}